

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irExpression *
build_ir_increxpr(Context_conflict *ctx,MOJOSHADER_astDataType *_dt,int val)

{
  undefined1 auVar1 [16];
  uint uVar2;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_irExpression *pMVar4;
  long lVar5;
  MOJOSHADER_astDataTypeType MVar6;
  float fVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  dt = reduce_datatype(ctx,_dt);
  pMVar3 = reduce_datatype(ctx,dt);
  MVar6 = pMVar3->type;
  if (MVar6 - MOJOSHADER_AST_DATATYPE_ARRAY < 4) {
    MVar6 = ((pMVar3->array).base)->type;
  }
  uVar2 = datatype_elems(ctx,dt);
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    (pMVar4->info).type = MVar6;
    (pMVar4->info).elements = uVar2;
  }
  auVar1 = _DAT_00158650;
  if (MVar6 - MOJOSHADER_AST_DATATYPE_FLOAT < 5) {
    if (0 < (int)uVar2) {
      fVar7 = (float)val;
      lVar5 = (ulong)uVar2 - 1;
      auVar10._8_4_ = (int)lVar5;
      auVar10._0_8_ = lVar5;
      auVar10._12_4_ = (int)((ulong)lVar5 >> 0x20);
      lVar5 = 0;
      auVar10 = auVar10 ^ _DAT_00158650;
      auVar14 = _DAT_00158a70;
      auVar13 = _DAT_00158a80;
      do {
        auVar15 = auVar13 ^ auVar1;
        iVar9 = auVar10._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar9 && auVar10._0_4_ < auVar15._0_4_ ||
                    iVar9 < auVar15._4_4_) & 1)) {
          *(float *)((long)pMVar4 + lVar5 + 0x20) = fVar7;
        }
        if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
            auVar15._12_4_ <= auVar10._12_4_) {
          *(float *)((long)pMVar4 + lVar5 + 0x24) = fVar7;
        }
        iVar16 = SUB164(auVar14 ^ auVar1,4);
        if (iVar16 <= iVar9 && (iVar16 != iVar9 || SUB164(auVar14 ^ auVar1,0) <= auVar10._0_4_)) {
          *(float *)((long)pMVar4 + lVar5 + 0x28) = fVar7;
          *(float *)((long)pMVar4 + lVar5 + 0x2c) = fVar7;
        }
        lVar11 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar11 + 4;
        lVar11 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar11 + 4;
        lVar5 = lVar5 + 0x10;
      } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar5);
    }
  }
  else {
    if (2 < MVar6 - MOJOSHADER_AST_DATATYPE_BOOL) {
      __assert_fail("0 && \"Semantic analysis should have caught this!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x144e,
                    "MOJOSHADER_irExpression *build_ir_increxpr(Context *, const MOJOSHADER_astDataType *, const int)"
                   );
    }
    if (0 < (int)uVar2) {
      lVar5 = (ulong)uVar2 - 1;
      auVar8._8_4_ = (int)lVar5;
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
      lVar5 = 0;
      auVar8 = auVar8 ^ _DAT_00158650;
      auVar15 = _DAT_00158a70;
      auVar12 = _DAT_00158a80;
      do {
        auVar14 = auVar12 ^ auVar1;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar14._4_4_ == iVar9 && auVar8._0_4_ < auVar14._0_4_ || iVar9 < auVar14._4_4_
                    ) & 1)) {
          *(int *)((long)pMVar4 + lVar5 + 0x20) = val;
        }
        if ((auVar14._12_4_ != auVar8._12_4_ || auVar14._8_4_ <= auVar8._8_4_) &&
            auVar14._12_4_ <= auVar8._12_4_) {
          *(int *)((long)pMVar4 + lVar5 + 0x24) = val;
        }
        iVar16 = SUB164(auVar15 ^ auVar1,4);
        if (iVar16 <= iVar9 && (iVar16 != iVar9 || SUB164(auVar15 ^ auVar1,0) <= auVar8._0_4_)) {
          *(int *)((long)pMVar4 + lVar5 + 0x28) = val;
          *(int *)((long)pMVar4 + lVar5 + 0x2c) = val;
        }
        lVar11 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 4;
        auVar12._8_8_ = lVar11 + 4;
        lVar11 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 4;
        auVar15._8_8_ = lVar11 + 4;
        lVar5 = lVar5 + 0x10;
      } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar5);
    }
  }
  return pMVar4;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_increxpr(Context *ctx, const MOJOSHADER_astDataType *_dt,
                                                  const int val)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, _dt);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    MOJOSHADER_irConstant *retval = (MOJOSHADER_irConstant *) new_ir_constant(ctx, type, elems);
    int i;

    switch (type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL:
        case MOJOSHADER_AST_DATATYPE_INT:
        case MOJOSHADER_AST_DATATYPE_UINT:
            for (i = 0; i < elems; i++)
                retval->value.ival[i] = (int) val;
            break;

        case MOJOSHADER_AST_DATATYPE_FLOAT:
        case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
        case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
        case MOJOSHADER_AST_DATATYPE_HALF:
        case MOJOSHADER_AST_DATATYPE_DOUBLE:
            for (i = 0; i < elems; i++)
                retval->value.fval[i] = (float) val;
            break;

        default:
            assert(0 && "Semantic analysis should have caught this!");
    } // switch

    return (MOJOSHADER_irExpression *) retval;
}